

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O0

size_t HUF_readStats(BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,
                    U32 *tableLogPtr,void *src,size_t srcSize)

{
  uint uVar1;
  U32 val;
  uint uVar2;
  U32 lastWeight;
  U32 verif;
  U32 rest;
  U32 total;
  U32 tableLog;
  U32 n_1;
  FSE_DTable fseWorkspace [65];
  U32 n;
  size_t oSize;
  size_t iSize;
  BYTE *ip;
  U32 weightTotal;
  void *src_local;
  U32 *tableLogPtr_local;
  U32 *nbSymbolsPtr_local;
  U32 *rankStats_local;
  size_t hwSize_local;
  BYTE *huffWeight_local;
  
  if (srcSize == 0) {
    return 0xffffffffffffffb8;
  }
  oSize = (size_t)*src;
  if (oSize < 0x80) {
    if (srcSize < oSize + 1) {
      return 0xffffffffffffffb8;
    }
    register0x00000000 =
         FSE_decompress_wksp(huffWeight,hwSize - 1,(void *)((long)src + 1),oSize,&tableLog,6);
    uVar1 = FSE_isError(register0x00000000);
    if (uVar1 != 0) {
      return stack0xffffffffffffffa0;
    }
  }
  else {
    register0x00000000 = oSize - 0x7f;
    oSize = oSize - 0x7e >> 1;
    if (srcSize < oSize + 1) {
      return 0xffffffffffffffb8;
    }
    if (hwSize <= register0x00000000) {
      return 0xffffffffffffffec;
    }
    for (fseWorkspace[0x3f] = 0; fseWorkspace[0x3f] < register0x00000000;
        fseWorkspace[0x3f] = fseWorkspace[0x3f] + 2) {
      huffWeight[fseWorkspace[0x3f]] =
           (BYTE)((int)(uint)*(byte *)((long)src + (ulong)(fseWorkspace[0x3f] >> 1) + 1) >> 4);
      huffWeight[fseWorkspace[0x3f] + 1] =
           *(byte *)((long)src + (ulong)(fseWorkspace[0x3f] >> 1) + 1) & 0xf;
    }
  }
  memset(rankStats,0,0x34);
  ip._4_4_ = 0;
  total = 0;
  while( true ) {
    if (stack0xffffffffffffffa0 <= total) {
      if (ip._4_4_ == 0) {
        huffWeight_local = (BYTE *)0xffffffffffffffec;
      }
      else {
        uVar1 = BIT_highbit32(ip._4_4_);
        uVar1 = uVar1 + 1;
        if (uVar1 < 0xd) {
          *tableLogPtr = uVar1;
          val = (1 << ((byte)uVar1 & 0x1f)) - ip._4_4_;
          uVar1 = BIT_highbit32(val);
          uVar2 = BIT_highbit32(val);
          uVar2 = uVar2 + 1;
          if (1 << ((byte)uVar1 & 0x1f) == val) {
            huffWeight[stack0xffffffffffffffa0] = (BYTE)uVar2;
            rankStats[uVar2] = rankStats[uVar2] + 1;
            if ((rankStats[1] < 2) || ((rankStats[1] & 1) != 0)) {
              huffWeight_local = (BYTE *)0xffffffffffffffec;
            }
            else {
              *nbSymbolsPtr = (int)stack0xffffffffffffffa0 + 1;
              huffWeight_local = (BYTE *)(oSize + 1);
            }
          }
          else {
            huffWeight_local = (BYTE *)0xffffffffffffffec;
          }
        }
        else {
          huffWeight_local = (BYTE *)0xffffffffffffffec;
        }
      }
      return (size_t)huffWeight_local;
    }
    if (0xb < huffWeight[total]) break;
    rankStats[huffWeight[total]] = rankStats[huffWeight[total]] + 1;
    ip._4_4_ = ((1 << (huffWeight[total] & 0x1f)) >> 1) + ip._4_4_;
    total = total + 1;
  }
  return 0xffffffffffffffec;
}

Assistant:

size_t HUF_readStats(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize)
{
    U32 weightTotal;
    const BYTE* ip = (const BYTE*) src;
    size_t iSize;
    size_t oSize;

    if (!srcSize) return ERROR(srcSize_wrong);
    iSize = ip[0];
    /* memset(huffWeight, 0, hwSize);   *//* is not necessary, even though some analyzer complain ... */

    if (iSize >= 128) {  /* special header */
        oSize = iSize - 127;
        iSize = ((oSize+1)/2);
        if (iSize+1 > srcSize) return ERROR(srcSize_wrong);
        if (oSize >= hwSize) return ERROR(corruption_detected);
        ip += 1;
        {   U32 n;
            for (n=0; n<oSize; n+=2) {
                huffWeight[n]   = ip[n/2] >> 4;
                huffWeight[n+1] = ip[n/2] & 15;
    }   }   }
    else  {   /* header compressed with FSE (normal case) */
        FSE_DTable fseWorkspace[FSE_DTABLE_SIZE_U32(6)];  /* 6 is max possible tableLog for HUF header (maybe even 5, to be tested) */
        if (iSize+1 > srcSize) return ERROR(srcSize_wrong);
        oSize = FSE_decompress_wksp(huffWeight, hwSize-1, ip+1, iSize, fseWorkspace, 6);   /* max (hwSize-1) values decoded, as last one is implied */
        if (FSE_isError(oSize)) return oSize;
    }

    /* collect weight stats */
    memset(rankStats, 0, (HUF_TABLELOG_MAX + 1) * sizeof(U32));
    weightTotal = 0;
    {   U32 n; for (n=0; n<oSize; n++) {
            if (huffWeight[n] >= HUF_TABLELOG_MAX) return ERROR(corruption_detected);
            rankStats[huffWeight[n]]++;
            weightTotal += (1 << huffWeight[n]) >> 1;
    }   }
    if (weightTotal == 0) return ERROR(corruption_detected);

    /* get last non-null symbol weight (implied, total must be 2^n) */
    {   U32 const tableLog = BIT_highbit32(weightTotal) + 1;
        if (tableLog > HUF_TABLELOG_MAX) return ERROR(corruption_detected);
        *tableLogPtr = tableLog;
        /* determine last weight */
        {   U32 const total = 1 << tableLog;
            U32 const rest = total - weightTotal;
            U32 const verif = 1 << BIT_highbit32(rest);
            U32 const lastWeight = BIT_highbit32(rest) + 1;
            if (verif != rest) return ERROR(corruption_detected);    /* last value must be a clean power of 2 */
            huffWeight[oSize] = (BYTE)lastWeight;
            rankStats[lastWeight]++;
    }   }

    /* check tree construction validity */
    if ((rankStats[1] < 2) || (rankStats[1] & 1)) return ERROR(corruption_detected);   /* by construction : at least 2 elts of rank 1, must be even */

    /* results */
    *nbSymbolsPtr = (U32)(oSize+1);
    return iSize+1;
}